

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void printf_btr_c_can(can_bittiming *bt,_Bool hdr)

{
  byte in_SIL;
  long in_RDI;
  uint32_t brpext;
  uint32_t btr;
  
  if ((in_SIL & 1) == 0) {
    printf("0x%04x 0x%04x",
           (ulong)(*(int *)(in_RDI + 0x1c) - 1U & 0x3f | (*(int *)(in_RDI + 0x18) - 1U & 3) << 6 |
                   ((*(int *)(in_RDI + 0xc) + *(int *)(in_RDI + 0x10)) - 1U & 0xf) << 8 |
                  (*(int *)(in_RDI + 0x14) - 1U & 7) << 0xc),
           (ulong)(*(int *)(in_RDI + 0x1c) - 1U >> 6 & 0xf));
  }
  else {
    printf("%13s","BTR BRPEXT");
  }
  return;
}

Assistant:

static void printf_btr_c_can(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%13s", "BTR BRPEXT");
	} else {
		uint32_t btr;
		uint32_t brpext;

		btr = (((bt->brp -1) & 0x3f) << 0) |
			(((bt->sjw -1) & 0x3) << 6) |
			(((bt->prop_seg + bt->phase_seg1 -1) & 0xf) << 8) |
			(((bt->phase_seg2 -1) & 0x7) << 12);
		brpext = ((bt->brp -1) >> 6) & 0xf;

		printf("0x%04x 0x%04x", btr, brpext);
	}
}